

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::reportArraySparse
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> sorted_index;
  string local_70;
  string local_50;
  
  if ((force | this->report_) == 1) {
    uVar1 = this->lp_->num_row_;
    if (vector->count < 0x1a) {
      if (vector->count < (int)uVar1) {
        std::vector<int,_std::allocator<int>_>::vector(&sorted_index,&vector->index);
        pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + vector->count);
        printf("%s",(message->_M_dataplus)._M_p);
        iVar5 = 0;
        uVar2 = 0;
        while( true ) {
          if ((long)vector->count <= (long)uVar2) break;
          uVar1 = sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2];
          if ((int)((uVar2 & 0xffffffff) / 5) * 5 + iVar5 == 0) {
            putchar(10);
          }
          printf("[%4d ",(ulong)uVar1);
          if (offset != 0) {
            printf("(%4d)",(ulong)(offset + uVar1));
          }
          printf("%11.4g] ",
                 (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar1]);
          uVar2 = uVar2 + 1;
          iVar5 = iVar5 + -1;
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&sorted_index.super__Vector_base<int,_std::allocator<int>_>);
      }
      else {
        uVar4 = 0;
        printf("%s",(message->_M_dataplus)._M_p);
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        iVar5 = 0;
        lVar3 = 0;
        while( true ) {
          if ((ulong)uVar1 * 8 == lVar3) break;
          if ((uVar4 / 5) * 5 + iVar5 == 0) {
            putchar(10);
          }
          printf("%11.4g ",
                 *(undefined8 *)
                  ((long)(vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar3));
          lVar3 = lVar3 + 8;
          iVar5 = iVar5 + -1;
          uVar4 = uVar4 + 1;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_50,(string *)message);
      std::__cxx11::string::string((string *)&local_70,"Unknown",(allocator *)&sorted_index);
      analyseVectorValues((HighsLogOptions *)0x0,&local_50,uVar1,&vector->array,true,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    putchar(10);
  }
  return;
}

Assistant:

void HSimplexNla::reportArraySparse(const std::string message,
                                    const HighsInt offset,
                                    const HVector* vector,
                                    const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (vector->count > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector->array, true);
  } else if (vector->count < num_row) {
    std::vector<HighsInt> sorted_index = vector->index;
    pdqsort(sorted_index.begin(), sorted_index.begin() + vector->count);
    printf("%s", message.c_str());
    for (HighsInt en = 0; en < vector->count; en++) {
      HighsInt iRow = sorted_index[en];
      if (en % 5 == 0) printf("\n");
      printf("[%4d ", (int)(iRow));
      if (offset) printf("(%4d)", (int)(offset + iRow));
      printf("%11.4g] ", vector->array[iRow]);
    }
  } else {
    if (num_row > kReportItemLimit) {
      analyseVectorValues(nullptr, message, num_row, vector->array, true);
      return;
    }
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow % 5 == 0) printf("\n");
      printf("%11.4g ", vector->array[iRow]);
    }
  }
  printf("\n");
}